

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O3

string * opn(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  _Elt_pointer pbVar2;
  string tok;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  temp;
  string local_a8;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_88,0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = std::__cxx11::string::find((char)str,0x20);
  if (lVar1 != -1) {
    do {
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)str);
      helper(&local_a8,
             (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_88,__return_storage_ptr__);
      std::__cxx11::string::erase((ulong)str,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      lVar1 = std::__cxx11::string::find((char)str,0x20);
    } while (lVar1 != -1);
  }
  helper(str,(stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_88,__return_storage_ptr__);
  while( true ) {
    if (((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
        ((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
        ((((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                  (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
        0x10 < 2) break;
    pbVar2 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar2 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)pbVar2[-1]._M_dataplus._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88);
  }
  pbVar2 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar2 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)pbVar2[-1]._M_dataplus._M_p)
  ;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

string opn (string str) {
    stack<string> temp;
    size_t  pos = 0;
    string res;
    while ((pos = str.find(' ')) != string::npos){  // получаем подстроку от начала до первого пробела
        string tok = str.substr(0, pos);
        helper(tok, temp, res);
        str.erase(0, pos + 1);
    }
    helper(str, temp, res);  // в конце строки нет пробела
    while (temp.size() > 1) {  // считываем стек в строку
        res += temp.top();
        res += " ";
        temp.pop();
    }
    res += temp.top();
    return res;
}